

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Tex>
          (Structure *this,Tex *dest,FileDatabase *db)

{
  undefined8 in_RAX;
  short temp_short;
  int temp;
  undefined8 uStack_28;
  
  uStack_28._4_4_ = (Type)((ulong)in_RAX >> 0x20);
  uStack_28._0_4_ = (uint)(ushort)in_RAX;
  ReadField<1,short>(this,(short *)((long)&uStack_28 + 2),"imaflag",db);
  dest->imaflag = (int)uStack_28._2_2_;
  uStack_28 = uStack_28 & 0xffffffff;
  ReadField<2,int>(this,(int *)((long)&uStack_28 + 4),"type",db);
  dest->type = uStack_28._4_4_;
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::Image>(this,&dest->ima,"*ima",db,false);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<Tex> (
    Tex& dest,
    const FileDatabase& db
    ) const
{
    short temp_short = 0;
    ReadField<ErrorPolicy_Igno>(temp_short,"imaflag",db);
    dest.imaflag = static_cast<Assimp::Blender::Tex::ImageFlags>(temp_short);
    int temp = 0;
    ReadField<ErrorPolicy_Fail>(temp,"type",db);
    dest.type = static_cast<Assimp::Blender::Tex::Type>(temp);
    ReadFieldPtr<ErrorPolicy_Warn>(dest.ima,"*ima",db);

    db.reader->IncPtr(size);
}